

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::LookupOne
          (Registry *this,Network *aPred,Network *aRet)

{
  Status SVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  undefined1 local_40 [8];
  NetworkArray networks;
  Status status;
  Network *aRet_local;
  Network *aPred_local;
  Registry *this_local;
  
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            *)local_40);
  iVar2 = (*this->mStorage->_vptr_PersistentStorage[0x16])(this->mStorage,aPred,local_40);
  networks.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
       anon_unknown_0::MapStatus((Status)iVar2);
  if (networks.
      super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == kSuccess) {
    sVar3 = std::
            vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ::size((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                    *)local_40);
    if (sVar3 == 1) {
      pvVar4 = std::
               vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ::operator[]((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                             *)local_40,0);
      Network::operator=(aRet,pvVar4);
    }
    else {
      networks.
      super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = kAmbiguity;
    }
  }
  SVar1 = networks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
             *)local_40);
  return SVar1;
}

Assistant:

Registry::Status Registry::LookupOne(const Network &aPred, Network &aRet)
{
    Registry::Status status;
    NetworkArray     networks;
    VerifyOrExit((status = MapStatus(mStorage->Lookup(aPred, networks))) == Registry::Status::kSuccess);
    VerifyOrExit(networks.size() == 1, status = Registry::Status::kAmbiguity);
    aRet = networks[0];
exit:
    return status;
}